

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountTest.cpp
# Opt level: O2

void __thiscall
oout::CountTest::CountTest
          (CountTest *this,
          list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
          *results)

{
  undefined1 auStack_28 [8];
  __shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::
  make_unique<oout::SuiteResult,std::__cxx11::list<std::shared_ptr<oout::Result_const>,std::allocator<std::shared_ptr<oout::Result_const>>>const&>
            ((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
              *)auStack_28);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::SuiteResult,std::default_delete<oout::SuiteResult>,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)(auStack_28 + 8),
             (unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)auStack_28);
  std::__shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2> *)(auStack_28 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_28 + 0x10));
  std::unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_>::~unique_ptr
            ((unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)auStack_28);
  return;
}

Assistant:

CountTest::CountTest(const list<shared_ptr<const Result>> &results)
	: CountTest(make_unique<SuiteResult>(results))
{
}